

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
LongsEqualFailure::LongsEqualFailure
          (LongsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,long expected,
          long actual,SimpleString *text)

{
  SimpleString *in_RDI;
  SimpleString expectedReported;
  SimpleString actualReported;
  SimpleString eDecimal;
  SimpleString aDecimal;
  SimpleString *in_stack_ffffffffffffff00;
  SimpleString *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff10;
  TestFailure *in_stack_ffffffffffffff18;
  SimpleString *in_stack_ffffffffffffff20;
  SimpleString *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  char in_stack_ffffffffffffff47;
  TestFailure *in_stack_ffffffffffffff48;
  TestFailure *in_stack_ffffffffffffff50;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffff50,(UtestShell *)in_stack_ffffffffffffff48,
             (char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  in_RDI->buffer_ = (char *)&PTR__LongsEqualFailure_001369e8;
  TestFailure::createUserText
            (in_stack_ffffffffffffff48,
             (SimpleString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  SimpleString::operator=(in_stack_ffffffffffffff00,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x117111);
  StringFrom((long)in_RDI);
  StringFrom((long)in_RDI);
  SimpleString::padStringsToSameLength
            ((SimpleString *)in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff47);
  SimpleString::SimpleString(in_stack_ffffffffffffff00,(char *)in_RDI);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  BracketsFormattedHexStringFrom((long)in_stack_ffffffffffffff28);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  SimpleString::~SimpleString((SimpleString *)0x1171be);
  SimpleString::~SimpleString((SimpleString *)0x1171c8);
  SimpleString::~SimpleString((SimpleString *)0x1171d2);
  SimpleString::SimpleString(in_stack_ffffffffffffff00,(char *)in_RDI);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  BracketsFormattedHexStringFrom((long)in_stack_ffffffffffffff28);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  SimpleString::~SimpleString((SimpleString *)0x117232);
  SimpleString::~SimpleString((SimpleString *)0x11723c);
  SimpleString::~SimpleString((SimpleString *)0x117246);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  SimpleString::operator+=(in_stack_ffffffffffffff00,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x117281);
  SimpleString::~SimpleString((SimpleString *)0x11728b);
  SimpleString::~SimpleString((SimpleString *)0x117298);
  SimpleString::~SimpleString((SimpleString *)0x1172a5);
  SimpleString::~SimpleString((SimpleString *)0x1172b2);
  return;
}

Assistant:

LongsEqualFailure::LongsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, long expected, long actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');

    SimpleString actualReported = aDecimal + " " + BracketsFormattedHexStringFrom(actual);
    SimpleString expectedReported = eDecimal + " " + BracketsFormattedHexStringFrom(expected);
    message_ += createButWasString(expectedReported, actualReported);
}